

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O0

int secp256k1_musig_nonce_gen_internal
              (secp256k1_context *ctx,secp256k1_musig_secnonce *secnonce,
              secp256k1_musig_pubnonce *pubnonce,uchar *input_nonce,uchar *seckey,
              secp256k1_pubkey *pubkey,uchar *msg32,secp256k1_musig_keyagg_cache *keyagg_cache,
              uchar *extra_input32)

{
  int iVar1;
  uint uVar2;
  void *in_RDX;
  secp256k1_context *in_RDI;
  long in_R8;
  long in_R9;
  secp256k1_keyagg_cache_internal cache_i;
  secp256k1_scalar sk;
  int ret;
  int pk_serialize_success;
  secp256k1_ge pk;
  uchar *aggpk_ser_ptr;
  uchar aggpk_ser [32];
  size_t pk_ser_len;
  uchar pk_ser [33];
  int i;
  secp256k1_gej nonce_ptj [2];
  secp256k1_ge nonce_pts [2];
  secp256k1_scalar k [2];
  secp256k1_musig_keyagg_cache *in_stack_fffffffffffffbe8;
  secp256k1_keyagg_cache_internal *in_stack_fffffffffffffbf0;
  secp256k1_context *in_stack_fffffffffffffbf8;
  size_t in_stack_fffffffffffffc10;
  secp256k1_gej *in_stack_fffffffffffffc18;
  secp256k1_ge *in_stack_fffffffffffffc20;
  uchar *in_stack_fffffffffffffd08;
  uint uVar3;
  uchar *in_stack_fffffffffffffd18;
  secp256k1_scalar *in_stack_fffffffffffffd20;
  secp256k1_gej *in_stack_fffffffffffffd28;
  secp256k1_ecmult_gen_context *in_stack_fffffffffffffd30;
  uchar *in_stack_fffffffffffffd40;
  uchar local_288 [40];
  undefined8 local_260;
  int local_22c;
  undefined1 local_128 [240];
  long local_38;
  long local_30;
  secp256k1_context *local_10;
  uint local_4;
  
  local_260 = 0x21;
  uVar3 = 1;
  if (in_RDX == (void *)0x0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_fffffffffffffbf0,(char *)in_stack_fffffffffffffbe8);
    local_4 = 0;
  }
  else {
    local_38 = in_R9;
    local_30 = in_R8;
    local_10 = in_RDI;
    memset(in_RDX,0,0x84);
    if (local_38 == 0) {
      secp256k1_callback_call
                ((secp256k1_callback *)in_stack_fffffffffffffbf0,(char *)in_stack_fffffffffffffbe8);
      local_4 = 0;
    }
    else {
      iVar1 = secp256k1_ecmult_gen_context_is_built(&local_10->ecmult_gen_ctx);
      if (iVar1 == 0) {
        secp256k1_callback_call
                  ((secp256k1_callback *)in_stack_fffffffffffffbf0,(char *)in_stack_fffffffffffffbe8
                  );
        local_4 = 0;
      }
      else {
        if (local_30 != 0) {
          uVar2 = secp256k1_scalar_set_b32_seckey
                            ((secp256k1_scalar *)in_stack_fffffffffffffbf0,
                             in_stack_fffffffffffffbe8->data);
          uVar3 = uVar2 & uVar3;
          secp256k1_scalar_clear((secp256k1_scalar *)0x10a6e2);
        }
        if (cache_i.pk.x.n[0] != 0) {
          iVar1 = secp256k1_keyagg_cache_load
                            (in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,
                             in_stack_fffffffffffffbe8);
          if (iVar1 == 0) {
            return 0;
          }
          secp256k1_fe_impl_get_b32(local_288,(secp256k1_fe *)&stack0xfffffffffffffbf8);
        }
        iVar1 = secp256k1_pubkey_load
                          (in_stack_fffffffffffffbf8,&in_stack_fffffffffffffbf0->pk,
                           (secp256k1_pubkey *)in_stack_fffffffffffffbe8);
        if (iVar1 == 0) {
          local_4 = 0;
        }
        else {
          iVar1 = secp256k1_eckey_pubkey_serialize
                            ((secp256k1_ge *)in_stack_fffffffffffffbf8,
                             (uchar *)in_stack_fffffffffffffbf0,(size_t *)in_stack_fffffffffffffbe8,
                             0);
          secp256k1_nonce_function_musig
                    ((secp256k1_scalar *)in_stack_fffffffffffffd30,
                     (uchar *)in_stack_fffffffffffffd28,(uchar *)in_stack_fffffffffffffd20,
                     in_stack_fffffffffffffd18,(uchar *)CONCAT44(iVar1,uVar3),
                     in_stack_fffffffffffffd08,in_stack_fffffffffffffd40);
          secp256k1_musig_secnonce_save
                    ((secp256k1_musig_secnonce *)in_stack_fffffffffffffbf0,
                     (secp256k1_scalar *)cache_i.pk.x.n[1],(secp256k1_ge *)0x10a7f7);
          secp256k1_musig_secnonce_invalidate
                    ((secp256k1_context *)in_stack_fffffffffffffbf0,
                     (secp256k1_musig_secnonce *)cache_i.pk.x.n[1],0);
          for (local_22c = 0; local_22c < 2; local_22c = local_22c + 1) {
            secp256k1_ecmult_gen
                      (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,in_stack_fffffffffffffd20
                      );
            secp256k1_scalar_clear((secp256k1_scalar *)0x10a88a);
          }
          secp256k1_ge_set_all_gej
                    (in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,in_stack_fffffffffffffc10);
          for (local_22c = 0; local_22c < 2; local_22c = local_22c + 1) {
            secp256k1_gej_clear((secp256k1_gej *)0x10a8e8);
          }
          for (local_22c = 0; local_22c < 2; local_22c = local_22c + 1) {
            secp256k1_declassify(local_10,local_128 + (long)local_22c * 0x58,0x58);
          }
          secp256k1_musig_pubnonce_save
                    ((secp256k1_musig_pubnonce *)in_stack_fffffffffffffbf0,
                     (secp256k1_ge *)cache_i.pk.x.n[1]);
          local_4 = uVar3;
        }
      }
    }
  }
  return local_4;
}

Assistant:

static int secp256k1_musig_nonce_gen_internal(const secp256k1_context* ctx, secp256k1_musig_secnonce *secnonce, secp256k1_musig_pubnonce *pubnonce, const unsigned char *input_nonce, const unsigned char *seckey, const secp256k1_pubkey *pubkey, const unsigned char *msg32, const secp256k1_musig_keyagg_cache *keyagg_cache, const unsigned char *extra_input32) {
    secp256k1_scalar k[2];
    secp256k1_ge nonce_pts[2];
    secp256k1_gej nonce_ptj[2];
    int i;
    unsigned char pk_ser[33];
    size_t pk_ser_len = sizeof(pk_ser);
    unsigned char aggpk_ser[32];
    unsigned char *aggpk_ser_ptr = NULL;
    secp256k1_ge pk;
    int pk_serialize_success;
    int ret = 1;

    ARG_CHECK(pubnonce != NULL);
    memset(pubnonce, 0, sizeof(*pubnonce));
    ARG_CHECK(pubkey != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));

    /* Check that the seckey is valid to be able to sign for it later. */
    if (seckey != NULL) {
        secp256k1_scalar sk;
        ret &= secp256k1_scalar_set_b32_seckey(&sk, seckey);
        secp256k1_scalar_clear(&sk);
    }

    if (keyagg_cache != NULL) {
        secp256k1_keyagg_cache_internal cache_i;
        if (!secp256k1_keyagg_cache_load(ctx, &cache_i, keyagg_cache)) {
            return 0;
        }
        /* The loaded point cache_i.pk can not be the point at infinity. */
        secp256k1_fe_get_b32(aggpk_ser, &cache_i.pk.x);
        aggpk_ser_ptr = aggpk_ser;
    }
    if (!secp256k1_pubkey_load(ctx, &pk, pubkey)) {
        return 0;
    }
    pk_serialize_success = secp256k1_eckey_pubkey_serialize(&pk, pk_ser, &pk_ser_len, 1);

#ifdef VERIFY
    /* A pubkey cannot be the point at infinity */
    VERIFY_CHECK(pk_serialize_success);
    VERIFY_CHECK(pk_ser_len == sizeof(pk_ser));
#else
    (void) pk_serialize_success;
#endif

    secp256k1_nonce_function_musig(k, input_nonce, msg32, seckey, pk_ser, aggpk_ser_ptr, extra_input32);
    VERIFY_CHECK(!secp256k1_scalar_is_zero(&k[0]));
    VERIFY_CHECK(!secp256k1_scalar_is_zero(&k[1]));
    secp256k1_musig_secnonce_save(secnonce, k, &pk);
    secp256k1_musig_secnonce_invalidate(ctx, secnonce, !ret);

    /* Compute pubnonce as two gejs */
    for (i = 0; i < 2; i++) {
        secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx, &nonce_ptj[i], &k[i]);
        secp256k1_scalar_clear(&k[i]);
    }

    /* Batch convert to two public ges */
    secp256k1_ge_set_all_gej(nonce_pts, nonce_ptj, 2);
    for (i = 0; i < 2; i++) {
        secp256k1_gej_clear(&nonce_ptj[i]);
    }

    for (i = 0; i < 2; i++) {
        secp256k1_declassify(ctx, &nonce_pts[i], sizeof(nonce_pts[i]));
    }
    /* None of the nonce_pts will be infinity because k != 0 with overwhelming
     * probability */
    secp256k1_musig_pubnonce_save(pubnonce, nonce_pts);
    return ret;
}